

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int get_num_opt(archive_write *a,int *num,int high,int low,char *key,char *value)

{
  int local_44;
  int neg;
  int data;
  char *p;
  char *value_local;
  char *key_local;
  int low_local;
  int high_local;
  int *num_local;
  archive_write *a_local;
  
  local_44 = 0;
  if (value == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Invalid value(empty) for option ``%s\'\'",key);
    a_local._4_4_ = -0x1e;
  }
  else {
    _neg = value;
    if (*value == '-') {
      _neg = value + 1;
    }
    for (; *_neg != '\0'; _neg = _neg + 1) {
      if ((*_neg < '0') || ('9' < *_neg)) {
        archive_set_error(&a->archive,-1,"Invalid value for option ``%s\'\'",key);
        return -0x1e;
      }
      local_44 = local_44 * 10 + (int)*_neg + -0x30;
      if (high < local_44) {
        archive_set_error(&a->archive,-1,"Invalid value(over %d) for option ``%s\'\'",
                          (ulong)(uint)high,key);
        return -0x1e;
      }
      if (local_44 < low) {
        archive_set_error(&a->archive,-1,"Invalid value(under %d) for option ``%s\'\'",
                          (ulong)(uint)low,key);
        return -0x1e;
      }
    }
    if (*value == '-') {
      local_44 = -local_44;
    }
    *num = local_44;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
get_num_opt(struct archive_write *a, int *num, int high, int low,
    const char *key, const char *value)
{
	const char *p = value;
	int data = 0;
	int neg = 0;

	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid value(empty) for option ``%s''", key);
		return (ARCHIVE_FATAL);
	}
	if (*p == '-') {
		neg = 1;
		p++;
	}
	while (*p) {
		if (*p >= '0' && *p <= '9')
			data = data * 10 + *p - '0';
		else {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value for option ``%s''", key);
			return (ARCHIVE_FATAL);
		}
		if (data > high) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(over %d) for "
			    "option ``%s''", high, key);
			return (ARCHIVE_FATAL);
		}
		if (data < low) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(under %d) for "
			    "option ``%s''", low, key);
			return (ARCHIVE_FATAL);
		}
		p++;
	}
	if (neg)
		data *= -1;
	*num = data;

	return (ARCHIVE_OK);
}